

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

void __thiscall
cmMakefileProfilingData::StartEntry
          (cmMakefileProfilingData *this,cmListFileFunction *lff,cmListFileContext *lfc)

{
  element_type *peVar1;
  pointer pcVar2;
  Value *pVVar3;
  const_iterator __begin2;
  pointer args_00;
  const_iterator __end2;
  string args;
  optional<Json::Value> argsValue;
  ValueHolder local_170;
  ValueHolder local_168;
  cmListFileContext *local_140;
  cmListFileFunction *local_138;
  cmMakefileProfilingData *local_130;
  ValueHolder local_128;
  long local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_100;
  string local_e0;
  cmAlphaNum local_c0;
  _Optional_payload_base<Json::Value> local_90;
  _Optional_payload_base<Json::Value> local_60;
  
  local_170.int_._0_4_ = 7;
  std::_Optional_payload_base<Json::Value>::_Optional_payload_base<Json::ValueType>(&local_90);
  peVar1 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  args_00 = (peVar1->Arguments).
            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar2 = *(pointer *)
            ((long)&(peVar1->Arguments).
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (args_00 != pcVar2) {
    local_128.string_ = (char *)&local_118;
    local_120 = 0;
    local_118._M_local_buf[0] = '\0';
    local_140 = lfc;
    local_138 = lff;
    local_130 = this;
    for (; args_00 != pcVar2; args_00 = args_00 + 1) {
      local_170.int_ = local_120;
      local_168.int_ = local_128.int_;
      local_c0.View_._M_len = (size_t)(local_120 != 0);
      local_c0.View_._M_str = "";
      if (local_120 != 0) {
        local_c0.View_._M_str = " ";
      }
      cmStrCat<std::__cxx11::string>(&local_100,(cmAlphaNum *)&local_170,&local_c0,&args_00->Value);
      std::__cxx11::string::operator=((string *)&local_128.bool_,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    Json::Value::Value((Value *)&local_170,(String *)&local_128);
    pVVar3 = Json::Value::operator[]((Value *)&local_90,"functionArgs");
    this = local_130;
    lff = local_138;
    Json::Value::operator=(pVVar3,(Value *)&local_170);
    Json::Value::~Value((Value *)&local_170);
    std::__cxx11::string::~string((string *)&local_128.bool_);
    lfc = local_140;
  }
  local_168 = (ValueHolder)(lfc->FilePath)._M_dataplus._M_p;
  local_170 = (ValueHolder)(lfc->FilePath)._M_string_length;
  local_c0.View_._M_str = local_c0.Digits_;
  local_c0.View_._M_len = 1;
  local_c0.Digits_[0] = ':';
  std::__cxx11::to_string(&local_e0,lfc->Line);
  cmStrCat<std::__cxx11::string>(&local_100,(cmAlphaNum *)&local_170,&local_c0,&local_e0);
  Json::Value::Value((Value *)&local_128,&local_100);
  pVVar3 = Json::Value::operator[]((Value *)&local_90,"location");
  Json::Value::operator=(pVVar3,(Value *)&local_128);
  Json::Value::~Value((Value *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170.bool_,"script",(allocator<char> *)&local_c0);
  peVar1 = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::_Optional_base<Json::Value,_false,_false>::_Optional_base
            ((_Optional_base<Json::Value,_false,_false> *)&local_60,
             (_Optional_base<Json::Value,_false,_false> *)&local_90);
  StartEntry(this,(string *)&local_170,&peVar1->LowerCaseName,(optional<Json::Value> *)&local_60);
  std::_Optional_payload_base<Json::Value>::_M_reset(&local_60);
  std::__cxx11::string::~string((string *)&local_170.bool_);
  std::_Optional_payload_base<Json::Value>::_M_reset(&local_90);
  return;
}

Assistant:

void cmMakefileProfilingData::StartEntry(const cmListFileFunction& lff,
                                         cmListFileContext const& lfc)
{
  cm::optional<Json::Value> argsValue(cm::in_place, Json::objectValue);
  if (!lff.Arguments().empty()) {
    std::string args;
    for (auto const& a : lff.Arguments()) {
      args = cmStrCat(args, args.empty() ? "" : " ", a.Value);
    }
    (*argsValue)["functionArgs"] = args;
  }
  (*argsValue)["location"] =
    cmStrCat(lfc.FilePath, ':', std::to_string(lfc.Line));
  this->StartEntry("script", lff.LowerCaseName(), std::move(argsValue));
}